

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

PipelineResourceAttribsType * __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceAttribs
          (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this,Uint32 ResIndex)

{
  char (*in_RCX) [37];
  string msg;
  string local_38;
  
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      ).m_Desc.NumResources <= ResIndex) {
    FormatString<char[26],char[37]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResIndex < this->m_Desc.NumResources",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x2c3);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return this->m_pResourceAttribs + ResIndex;
}

Assistant:

const PipelineResourceAttribsType& GetResourceAttribs(Uint32 ResIndex) const
    {
        VERIFY_EXPR(ResIndex < this->m_Desc.NumResources);
        return m_pResourceAttribs[ResIndex];
    }